

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O1

void __thiscall testing::internal::ExpectationBase::CheckActionCountIfNotDone(ExpectationBase *this)

{
  Mutex *this_00;
  pointer ppvVar1;
  pointer ppvVar2;
  CardinalityInterface *pCVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  ostream *poVar8;
  char *pcVar9;
  char *pcVar10;
  int iVar11;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  this_00 = &this->mutex_;
  MutexBase::Lock(&this_00->super_MutexBase);
  if (this->action_count_checked_ == false) {
    this->action_count_checked_ = true;
    MutexBase::Unlock(&this_00->super_MutexBase);
    if (this->cardinality_specified_ == true) {
      ppvVar1 = (this->untyped_actions_).
                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ppvVar2 = (this->untyped_actions_).
                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar5 = (*((this->cardinality_).impl_.value_)->_vptr_CardinalityInterface[3])();
      iVar6 = (*((this->cardinality_).impl_.value_)->_vptr_CardinalityInterface[2])();
      bVar4 = true;
      iVar11 = (int)((ulong)((long)ppvVar1 - (long)ppvVar2) >> 3);
      if ((iVar11 <= iVar5) && ((iVar5 != iVar11 || (this->repeated_action_specified_ == false)))) {
        if (iVar11 < 1) {
          return;
        }
        if (iVar6 <= iVar11) {
          return;
        }
        if (this->repeated_action_specified_ != false) {
          return;
        }
        bVar4 = false;
      }
      std::__cxx11::stringstream::stringstream(local_1b8);
      DescribeLocationTo(this,(ostream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Too ",4);
      pcVar9 = "few";
      if (bVar4) {
        pcVar9 = "many";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,pcVar9,(ulong)bVar4 + 3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8," actions specified in ",0x16);
      pcVar9 = (this->source_text_)._M_dataplus._M_p;
      if (pcVar9 == (char *)0x0) {
        std::ios::clear((int)(ostream *)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
      }
      else {
        sVar7 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"...\n",4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Expected to be ",0xf)
      ;
      pCVar3 = (this->cardinality_).impl_.value_;
      (*pCVar3->_vptr_CardinalityInterface[6])(pCVar3,(ostream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", but has ",10);
      pcVar10 = "";
      pcVar9 = "only ";
      if (bVar4 != false) {
        pcVar9 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,pcVar9,(ulong)(bVar4 ^ 1) * 5);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," WillOnce()",0xb);
      if (iVar11 != 1) {
        pcVar10 = "s";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar10,(ulong)(iVar11 != 1));
      if (this->repeated_action_specified_ == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8," and a WillRepeatedly()",0x17);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
      std::__cxx11::stringbuf::str();
      Log(kWarning,&local_1d8,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
    }
  }
  else {
    MutexBase::Unlock(&this_00->super_MutexBase);
  }
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  bool should_check = false;
  {
    MutexLock l(&mutex_);
    if (!action_count_checked_) {
      action_count_checked_ = true;
      should_check = true;
    }
  }

  if (should_check) {
    if (!cardinality_specified_) {
      // The cardinality was inferred - no need to check the action
      // count against it.
      return;
    }

    // The cardinality was explicitly specified.
    const int action_count = static_cast<int>(untyped_actions_.size());
    const int upper_bound = cardinality().ConservativeUpperBound();
    const int lower_bound = cardinality().ConservativeLowerBound();
    bool too_many;  // True if there are too many actions, or false
    // if there are too few.
    if (action_count > upper_bound ||
        (action_count == upper_bound && repeated_action_specified_)) {
      too_many = true;
    } else if (0 < action_count && action_count < lower_bound &&
               !repeated_action_specified_) {
      too_many = false;
    } else {
      return;
    }

    ::std::stringstream ss;
    DescribeLocationTo(&ss);
    ss << "Too " << (too_many ? "many" : "few")
       << " actions specified in " << source_text() << "...\n"
       << "Expected to be ";
    cardinality().DescribeTo(&ss);
    ss << ", but has " << (too_many ? "" : "only ")
       << action_count << " WillOnce()"
       << (action_count == 1 ? "" : "s");
    if (repeated_action_specified_) {
      ss << " and a WillRepeatedly()";
    }
    ss << ".";
    Log(kWarning, ss.str(), -1);  // -1 means "don't print stack trace".
  }
}